

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeSetHasContent(BtShared *pBt,Pgno pgno)

{
  int iVar1;
  Bitvec *p;
  uint uVar2;
  
  p = pBt->pHasContent;
  if (p == (Bitvec *)0x0) {
    uVar2 = pBt->nPage;
    p = (Bitvec *)sqlite3Malloc(0x200);
    if (p == (Bitvec *)0x0) {
      pBt->pHasContent = (Bitvec *)0x0;
      return 7;
    }
    memset(&p->nSet,0,0x1fc);
    p->iSize = uVar2;
    pBt->pHasContent = p;
  }
  else {
    uVar2 = p->iSize;
  }
  if (uVar2 < pgno) {
    return 0;
  }
  iVar1 = sqlite3BitvecSet(p,pgno);
  return iVar1;
}

Assistant:

static int btreeSetHasContent(BtShared *pBt, Pgno pgno){
  int rc = SQLITE_OK;
  if( !pBt->pHasContent ){
    assert( pgno<=pBt->nPage );
    pBt->pHasContent = sqlite3BitvecCreate(pBt->nPage);
    if( !pBt->pHasContent ){
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  if( rc==SQLITE_OK && pgno<=sqlite3BitvecSize(pBt->pHasContent) ){
    rc = sqlite3BitvecSet(pBt->pHasContent, pgno);
  }
  return rc;
}